

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalSubtyping.cpp
# Opt level: O0

Pass * wasm::createLocalSubtypingPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x108);
  memset(this,0,0x108);
  LocalSubtyping::LocalSubtyping((LocalSubtyping *)this);
  return this;
}

Assistant:

Pass* createLocalSubtypingPass() { return new LocalSubtyping(); }